

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QSynth.cpp
# Opt level: O2

void __thiscall QSynth::startRecordingAudio(QSynth *this,QString *fileName)

{
  AudioFileWriter *this_00;
  int __oflag;
  double dVar1;
  QMutexLocker<QMutex> synthLocker;
  
  QMutexLocker<QMutex>::QMutexLocker(&synthLocker,this->synthMutex);
  if (this->audioRecorder != (AudioFileWriter *)0x0) {
    (*this->audioRecorder->_vptr_AudioFileWriter[1])();
  }
  this_00 = (AudioFileWriter *)operator_new(0x48);
  dVar1 = MT32Emu::SampleRateConverter::convertSynthToOutputTimestamp
                    (this->sampleRateConverter,32000.0);
  AudioFileWriter::AudioFileWriter(this_00,(uint)(long)dVar1,fileName);
  this->audioRecorder = this_00;
  AudioFileWriter::open(this_00,(char *)0x1,__oflag);
  QMutexLocker<QMutex>::unlock(&synthLocker);
  return;
}

Assistant:

void QSynth::startRecordingAudio(const QString &fileName) {
	QMutexLocker synthLocker(synthMutex);
	if (isRecordingAudio()) delete audioRecorder;
	audioRecorder = new AudioFileWriter(sampleRateConverter->convertSynthToOutputTimestamp(SAMPLE_RATE), fileName);
	audioRecorder->open();
}